

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

char * VmFindShortOpt(int c,char *zIn,char *zEnd)

{
  char *zEnd_local;
  char *zIn_local;
  int c_local;
  
  zEnd_local = zIn;
  while( true ) {
    if (zEnd <= zEnd_local) {
      return (char *)0x0;
    }
    if (((*zEnd_local == '-') && (zEnd_local + 1 < zEnd)) && (zEnd_local[1] == c)) break;
    zEnd_local = zEnd_local + 1;
  }
  return zEnd_local + 1;
}

Assistant:

static const char * VmFindShortOpt(int c, const char *zIn, const char *zEnd)
{
	while( zIn < zEnd ){
		if( zIn[0] == '-' && &zIn[1] < zEnd && (int)zIn[1] == c ){
			/* Got one */
			return &zIn[1];
		}
		/* Advance the cursor */
		zIn++;
	}
	/* No such option */
	return 0;
}